

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::kway_min_id_heap
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id_count)

{
  undefined4 in_EAX;
  size_type __n;
  undefined4 uStack_28;
  value_type_conflict local_24;
  
  this->heap_end = 0;
  __n = (size_type)id_count;
  uStack_28 = in_EAX;
  std::
  vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
  ::vector(&this->heap,__n,(allocator_type *)((long)&uStack_28 + 3));
  _uStack_28 = CONCAT44(0xffffffff,uStack_28);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->id_pos,__n,&local_24,(allocator_type *)((long)&uStack_28 + 2));
  uStack_28._0_2_ = (ushort)(byte)uStack_28._0_1_;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->contained_flags,__n,(bool *)((long)&uStack_28 + 1),(allocator_type *)&uStack_28)
  ;
  return;
}

Assistant:

explicit kway_min_id_heap(int id_count,
        key_order_type order = key_order_type())
        : heap_end(0)
        , heap(id_count)
        , id_pos(id_count, -1)
        , order(std::move(order))
        , contained_flags(id_count, false)
    {
        check_id_invariants();
        check_order_invariants();
    }